

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserDPOMDPFormat_Spirit.h
# Opt level: O2

void __thiscall
DPOMDPFormatParsing::ParserDPOMDPFormat_Spirit::AddAgents::operator()
          (AddAgents *this,iterator_t *first,iterator_t *last)

{
  pointer pbVar1;
  DecPOMDPDiscrete *this_00;
  ParserDPOMDPFormat_Spirit *this_01;
  pointer pbVar2;
  string sStack_48;
  
  MultiAgentDecisionProcess::SetNrAgents
            ((MultiAgentDecisionProcess *)this->_m_po->_m_decPOMDPDiscrete,0);
  this_01 = this->_m_po;
  pbVar1 = (this_01->_m_curIdentList).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar2 = (this_01->_m_curIdentList).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar2 != pbVar1; pbVar2 = pbVar2 + 1) {
    this_00 = this_01->_m_decPOMDPDiscrete;
    std::__cxx11::string::string((string *)&sStack_48,(string *)pbVar2);
    MultiAgentDecisionProcess::AddAgent((MultiAgentDecisionProcess *)this_00,&sStack_48);
    std::__cxx11::string::~string((string *)&sStack_48);
    this_01 = this->_m_po;
    this_01->_m_nrA = this_01->_m_nrA + 1;
  }
  ClearCurIdentList(this_01);
  return;
}

Assistant:

void operator()(iterator_t first, iterator_t last) const
            {   
                _m_po->GetDecPOMDPDiscrete()->SetNrAgents(0);
                std::vector<std::string>::iterator it = _m_po->_m_curIdentList.begin();
                std::vector<std::string>::iterator l = _m_po->_m_curIdentList.end();
                while(it != l)
                {
                    _m_po->GetDecPOMDPDiscrete()->AddAgent(*it);
                    it++;
                    _m_po->_m_nrA++;
                }
                _m_po->ClearCurIdentList();
            }